

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::MILSpec::TensorValue::ByteSizeLong(TensorValue *this)

{
  size_type sVar1;
  int iVar2;
  TensorValue_RepeatedFloats *pTVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    pTVar3 = (this->value_).floats_;
    uVar8 = (ulong)(uint)(pTVar3->values_).current_size_;
    uVar5 = uVar8 * 4;
    goto LAB_002d48d5;
  case 2:
    sVar4 = TensorValue_RepeatedInts::ByteSizeLong((this->value_).ints_);
    break;
  case 3:
    pTVar3 = (this->value_).floats_;
    uVar7 = (pTVar3->values_).current_size_;
    uVar5 = (ulong)uVar7;
    if (uVar5 == 0) {
      uVar8 = 0;
    }
    else if ((int)uVar7 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar7 | 1) != 0) {
        for (; (uVar7 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar8 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    pTVar3->_values_cached_byte_size_ = uVar7;
    goto LAB_002d4959;
  case 4:
    sVar4 = TensorValue_RepeatedStrings::ByteSizeLong((this->value_).strings_);
    break;
  case 5:
    sVar4 = TensorValue_RepeatedLongInts::ByteSizeLong((this->value_).longints_);
    break;
  case 6:
    pTVar3 = (this->value_).floats_;
    uVar8 = (ulong)(uint)(pTVar3->values_).current_size_;
    uVar5 = uVar8 * 8;
LAB_002d48d5:
    if (uVar8 == 0) {
      uVar7 = 0;
      uVar8 = 0;
    }
    else {
      uVar7 = (uint)uVar5;
      if ((int)uVar7 < 0) {
        uVar8 = 0xb;
      }
      else {
        iVar2 = 0x1f;
        if ((uVar7 | 1) != 0) {
          for (; (uVar7 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar8 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
    }
    pTVar3->_values_cached_byte_size_ = uVar7;
LAB_002d4959:
    uVar7 = (uint)(uVar8 + uVar5);
    pTVar3->_cached_size_ = uVar7;
    uVar7 = uVar7 | 1;
    iVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = (ulong)(iVar2 * 9 + 0x49U >> 6) + uVar8 + uVar5 + 1;
    goto LAB_002d4976;
  case 7:
    sVar1 = ((((this->value_).bytes_)->values_).ptr_)->_M_string_length;
    if (sVar1 == 0) {
      lVar6 = 0;
    }
    else {
      uVar7 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar6 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
    }
    ((this->value_).bytes_)->_cached_size_ = (uint)lVar6;
    uVar7 = (uint)lVar6 | 1;
    iVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = (ulong)(iVar2 * 9 + 0x49U >> 6) + lVar6 + 1;
    goto LAB_002d4976;
  default:
    sVar4 = 0;
    goto LAB_002d4976;
  }
  uVar7 = (uint)sVar4 | 1;
  iVar2 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar4 = sVar4 + (iVar2 * 9 + 0x49U >> 6) + 1;
LAB_002d4976:
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t TensorValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue)
  size_t total_size = 0;

  switch (value_case()) {
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
    case kFloats: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.floats_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
    case kInts: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.ints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
    case kBools: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.bools_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
    case kStrings: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.strings_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
    case kLongInts: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.longints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
    case kDoubles: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.doubles_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
    case kBytes: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.bytes_);
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}